

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

DynamicSize *
slang::ast::dynamicBitstreamSize
          (DynamicSize *__return_storage_ptr__,Type *type,BitstreamSizeMode mode)

{
  int iVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bitwidth_t bVar9;
  Type *pTVar10;
  int iVar11;
  long lVar13;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar14;
  uint64_t multiplier;
  uint64_t fixedSize;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin5;
  anon_class_24_3_5278a87e handleField;
  BitstreamSizeMode local_74;
  Symbol *local_70;
  Symbol *local_68;
  DynamicSize local_60;
  anon_class_24_3_5278a87e local_48;
  ulong uVar12;
  
  local_70 = (Symbol *)0x0;
  local_74 = mode;
  bVar9 = Type::getBitWidth(type);
  local_68 = (Symbol *)(ulong)bVar9;
  if (bVar9 == 0) {
    bVar8 = Type::isString(type);
    if (bVar8) {
      __return_storage_ptr__->multiplier = (ulong)(mode != DestEmpty) << 3;
      __return_storage_ptr__->fixed = 0;
      goto LAB_003cf858;
    }
    local_48.mode = &local_74;
    local_48.multiplier = (uint64_t *)&local_70;
    local_48.fixedSize = (uint64_t *)&local_68;
    bVar8 = Type::isUnpackedArray(type);
    if (bVar8) {
      pTVar10 = Type::getArrayElementType(type);
      dynamicBitstreamSize(&local_60,pTVar10,local_74);
      if (local_60.isValid == false) {
        *(ulong *)&__return_storage_ptr__->isValid = (ulong)(uint7)local_60._17_7_ << 8;
        __return_storage_ptr__->multiplier = local_60.multiplier;
        __return_storage_ptr__->fixed = local_60.fixed;
        return __return_storage_ptr__;
      }
      pTVar10 = Type::getCanonicalType(type);
      if ((pTVar10->super_Symbol).kind == FixedSizeUnpackedArrayType) {
        iVar1 = (int)pTVar10[1].super_Symbol.name._M_len;
        iVar2 = *(int *)((long)&pTVar10[1].super_Symbol.name._M_len + 4);
        iVar11 = iVar1 - iVar2;
        if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
          iVar11 = -(iVar1 - iVar2);
        }
        uVar12 = CONCAT44(0,iVar11 + 1);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar12;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_60.fixed;
        local_68 = SUB168(auVar4 * auVar6,0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar12;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_60.multiplier;
        local_70 = SUB168(auVar5 * auVar7,0);
        if ((((SUB168(auVar5 * auVar7,8) != 0) || (SUB168(auVar4 * auVar6,8) != 0)) ||
            ((Symbol *)0x3fffffff8 < local_70)) || ((Symbol *)0x3fffffff8 < local_68))
        goto LAB_003cf970;
      }
      else if (local_74 == Source) {
        local_70 = (Symbol *)std::__detail::__gcd<unsigned_long>(local_60.multiplier,local_60.fixed)
        ;
      }
      else if ((local_74 == DestFill) &&
              (local_70 = (Symbol *)local_60.fixed, (Symbol *)local_60.multiplier != (Symbol *)0x0))
      {
        local_70 = (Symbol *)local_60.multiplier;
        local_68 = (Symbol *)local_60.fixed;
      }
    }
    else {
      bVar8 = Type::isUnpackedStruct(type);
      if (bVar8) {
        pTVar10 = Type::getCanonicalType(type);
        pSVar3 = pTVar10[1].super_Symbol.originatingSyntax;
        pTVar10 = pTVar10[1].canonical;
        lVar13 = 0;
        do {
          if ((long)pTVar10 << 3 == lVar13) goto LAB_003cfa2d;
          bVar8 = dynamicBitstreamSize::anon_class_24_3_5278a87e::operator()
                            (&local_48,*(ValueSymbol **)((long)&pSVar3->kind + lVar13));
          lVar13 = lVar13 + 8;
        } while (bVar8);
LAB_003cf970:
        __return_storage_ptr__->multiplier = 0;
        __return_storage_ptr__->fixed = 0;
        *(undefined8 *)&__return_storage_ptr__->isValid = 0;
        return __return_storage_ptr__;
      }
      bVar8 = Type::isClass(type);
      if (bVar8) {
        pTVar10 = Type::getCanonicalType(type);
        sVar14 = Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)(pTVar10 + 1));
        local_60.multiplier = (uint64_t)sVar14._M_begin.current;
        while ((Symbol *)local_60.multiplier != sVar14._M_end.current.current) {
          bVar8 = dynamicBitstreamSize::anon_class_24_3_5278a87e::operator()
                            (&local_48,(ValueSymbol *)local_60.multiplier);
          if (!bVar8) goto LAB_003cf970;
          Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::increment
                    ((specific_symbol_iterator<slang::ast::ClassPropertySymbol> *)&local_60);
        }
      }
    }
LAB_003cfa2d:
    __return_storage_ptr__->multiplier = (uint64_t)local_70;
  }
  else {
    __return_storage_ptr__->multiplier = 0;
  }
  __return_storage_ptr__->fixed = (uint64_t)local_68;
LAB_003cf858:
  __return_storage_ptr__->isValid = true;
  return __return_storage_ptr__;
}

Assistant:

static DynamicSize dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    uint64_t multiplier = 0;
    uint64_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0u : CHAR_BIT, 0u};

    auto handleField = [&](const ValueSymbol& field) {
        auto elemSize = dynamicBitstreamSize(field.getType(), mode);
        if (!elemSize)
            return false;

        // If a dynamically sized field is filled the rest should be empty.
        if (mode == BitstreamSizeMode::DestFill && elemSize.multiplier > 0)
            mode = BitstreamSizeMode::DestEmpty;

        multiplier = std::gcd(multiplier, elemSize.multiplier);
        fixedSize += elemSize.fixed;
        if (fixedSize > Type::MaxBitWidth)
            return false;

        return true;
    };

    if (type.isUnpackedArray()) {
        auto elemSize = dynamicBitstreamSize(*type.getArrayElementType(), mode);
        if (!elemSize)
            return elemSize;

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            auto mul = checkedMulU64(elemSize.multiplier, rw);
            auto fixed = checkedMulU64(elemSize.fixed, rw);
            if (!mul || !fixed || mul > Type::MaxBitWidth || fixed > Type::MaxBitWidth)
                return {};

            multiplier = *mul;
            fixedSize = *fixed;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!elemSize.multiplier) {
                multiplier = elemSize.fixed; // element is fixed size
            }
            else {
                multiplier = elemSize.multiplier; // element is dynamically sized
                fixedSize = elemSize.fixed;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(elemSize.multiplier, elemSize.fixed);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto field : us.fields) {
            if (!handleField(*field))
                return {};
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        SLANG_ASSERT(!ct.hasCycles());
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            if (!handleField(prop))
                return {};
        }
    }

    return {multiplier, fixedSize};
}